

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.hpp
# Opt level: O2

string * __thiscall
czh::error::CzhError::get_content_abi_cxx11_(string *__return_storage_ptr__,CzhError *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::operator+(&local_38,"\x1b[1;37m",&this->location);
  std::operator+(&bStack_78,&local_38,": ");
  std::operator+(&local_58,&bStack_78,"\x1b[0;32;31mError: \x1b[m");
  std::operator+(__return_storage_ptr__,&local_58,&this->detail);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&bStack_78);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] std::string get_content() const
    {
      return {"\033[1;37m" + location + ": "
              + "\033[0;32;31mError: \033[m" + detail};
    }